

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitNumberOf
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,NumberOfExpr e)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  value.size_ = 9;
  value.data_ = "numberof ";
  fmt::BasicWriter<char>::operator<<(this->writer_,value);
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ +
             8))->impl_,0);
  value_00.size_ = 4;
  value_00.data_ = " in ";
  fmt::BasicWriter<char>::operator<<(this->writer_,value_00);
  ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
  WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
            ((ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer> *)this,
             (Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                             super_ExprBase.impl_ + 0x10),
             (Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                             super_ExprBase.impl_ +
                       (long)*(int *)((long)e.
                                            super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                            super_ExprBase.impl_ + 4) * 8 + 8),", ",0);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitNumberOf(NumberOfExpr e) {
  writer_ << "numberof ";
  typename NumberOfExpr::iterator i = e.begin();
  Visit(*i++, prec::UNKNOWN);
  writer_ << " in ";
  WriteArgs(i, e.end());
}